

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.cpp
# Opt level: O0

string * to_string_abi_cxx11_(string *__return_storage_ptr__,Range *range)

{
  bool bVar1;
  int iVar2;
  _Setw _Var3;
  ostream *poVar4;
  char *pcVar5;
  allocator<char> local_1a5 [13];
  char *local_198;
  char *separator;
  ostringstream ss;
  Range *range_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&separator);
  local_198 = ", ";
  bVar1 = Range::empty(range);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"All Tracks",local_1a5);
    std::allocator<char>::~allocator(local_1a5);
  }
  else {
    iVar2 = Range::cyls(range);
    if (iVar2 == 1) {
      poVar4 = std::operator<<((ostream *)&separator,"Cyl ");
      pcVar5 = CylStr(range->cyl_begin);
      std::operator<<(poVar4,pcVar5);
    }
    else if (range->cyl_begin == 0) {
      _Var3 = std::setw(2);
      poVar4 = std::operator<<((ostream *)&separator,_Var3);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,range->cyl_end);
      std::operator<<(poVar4," Cyls");
      local_198 = " ";
    }
    else {
      poVar4 = std::operator<<((ostream *)&separator,"Cyls ");
      pcVar5 = CylStr(range->cyl_begin);
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4,'-');
      pcVar5 = CylStr(range->cyl_end + -1);
      std::operator<<(poVar4,pcVar5);
    }
    iVar2 = Range::heads(range);
    if (iVar2 == 1) {
      poVar4 = std::operator<<((ostream *)&separator," Head ");
      std::ostream::operator<<(poVar4,range->head_begin);
    }
    else if (range->head_begin == 0) {
      poVar4 = std::operator<<((ostream *)&separator,local_198);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,range->head_end);
      std::operator<<(poVar4," Heads");
    }
    else {
      poVar4 = std::operator<<((ostream *)&separator," Heads ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,range->head_begin);
      poVar4 = std::operator<<(poVar4,'-');
      std::ostream::operator<<(poVar4,range->head_end + -1);
    }
    std::__cxx11::ostringstream::str();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&separator);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Range& range)
{
    std::ostringstream ss;
    auto separator = ", ";

    if (range.empty())
        return "All Tracks";

    if (range.cyls() == 1)
        ss << "Cyl " << CylStr(range.cyl_begin);
    else if (range.cyl_begin == 0)
    {
        ss << std::setw(2) << range.cyl_end << " Cyls";
        separator = " ";
    }
    else
        ss << "Cyls " << CylStr(range.cyl_begin) << '-' << CylStr(range.cyl_end - 1);

    if (range.heads() == 1)
        ss << " Head " << range.head_begin;
    else if (range.head_begin == 0)
        ss << separator << range.head_end << " Heads";
    else
        ss << " Heads " << range.head_begin << '-' << (range.head_end - 1);

    return ss.str();
}